

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

FT_Error ps_dimension_end(PS_Dimension dim,FT_UInt end_point,FT_Memory memory)

{
  FT_Error FVar1;
  FT_Memory memory_local;
  FT_UInt end_point_local;
  PS_Dimension dim_local;
  
  ps_dimension_end_mask(dim,end_point);
  FVar1 = ps_mask_table_merge_all(&dim->counters,memory);
  return FVar1;
}

Assistant:

static FT_Error
  ps_dimension_end( PS_Dimension  dim,
                    FT_UInt       end_point,
                    FT_Memory     memory )
  {
    /* end hint mask table */
    ps_dimension_end_mask( dim, end_point );

    /* merge all counter masks into independent "paths" */
    return ps_mask_table_merge_all( &dim->counters, memory );
  }